

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substitute.cc
# Opt level: O2

void __thiscall absl::lts_20250127::substitute_internal::Arg::Arg(Arg *this,Dec dec)

{
  byte bVar1;
  ulong uVar2;
  size_t __n;
  char *__s;
  
  uVar2 = dec.value;
  (this->piece_)._M_len = 0;
  (this->piece_)._M_str = (char *)0x0;
  if (dec.width < 0x21) {
    __s = this->scratch_ + 0x1f;
    for (; 9 < uVar2; uVar2 = uVar2 / 10) {
      *__s = (byte)(uVar2 % 10) | 0x30;
      __s = __s + -1;
    }
    *__s = (byte)uVar2 | 0x30;
    if ((dec._8_4_ >> 0x10 & 1) != 0) {
      __s[-1] = 0x2d;
      __s = __s + -1;
    }
    __n = (long)__s - ((long)this + (0x30 - (ulong)(dec._8_4_ & 0x3f)));
    if (0 < (long)__n) {
      bVar1 = dec.fill == '0' & dec.neg;
      __s = __s + (bVar1 - __n);
      memset(__s,dec._9_4_ & 0xff,__n);
      if (bVar1 == 1) {
        __s[-1] = 0x2d;
        __s = __s + -1;
      }
    }
    (this->piece_)._M_len = (long)this + (0x30 - (long)__s);
    (this->piece_)._M_str = __s;
    return;
  }
  __assert_fail("dec.width <= numbers_internal::kFastToBufferSize",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/strings/substitute.cc"
                ,0x9a,"absl::substitute_internal::Arg::Arg(Dec)");
}

Assistant:

Arg::Arg(Dec dec) {
  assert(dec.width <= numbers_internal::kFastToBufferSize);
  char* const end = &scratch_[numbers_internal::kFastToBufferSize];
  char* const minfill = end - dec.width;
  char* writer = end;
  uint64_t value = dec.value;
  bool neg = dec.neg;
  while (value > 9) {
    *--writer = '0' + (value % 10);
    value /= 10;
  }
  *--writer = '0' + static_cast<char>(value);
  if (neg) *--writer = '-';

  ptrdiff_t fillers = writer - minfill;
  if (fillers > 0) {
    // Tricky: if the fill character is ' ', then it's <fill><+/-><digits>
    // But...: if the fill character is '0', then it's <+/-><fill><digits>
    bool add_sign_again = false;
    if (neg && dec.fill == '0') {  // If filling with '0',
      ++writer;                    // ignore the sign we just added
      add_sign_again = true;       // and re-add the sign later.
    }
    writer -= fillers;
    std::fill_n(writer, fillers, dec.fill);
    if (add_sign_again) *--writer = '-';
  }

  piece_ = absl::string_view(writer, static_cast<size_t>(end - writer));
}